

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

bool __thiscall
rapidjson::internal::Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Uint
          (Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,uint u)

{
  bool bVar1;
  U local_28;
  Number n;
  uint u_local;
  Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  local_28.u._4_4_ = 0;
  local_28.u._0_4_ = u;
  n.u = (U)(double)u;
  n.d._4_4_ = u;
  bVar1 = WriteNumber(this,(Number *)&local_28);
  return bVar1;
}

Assistant:

bool Uint(unsigned u) { Number n; n.u.u = u; n.d = static_cast<double>(u); return WriteNumber(n); }